

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

int sam_hdr_rebuild(SAM_hdr *hdr)

{
  long lVar1;
  SAM_hdr_item_s *pSVar2;
  khint_t kVar3;
  int iVar4;
  char *pcVar5;
  undefined1 local_62;
  undefined1 local_61;
  SAM_hdr_tag *pSStack_60;
  char c [2];
  SAM_hdr_tag *tag_1;
  SAM_hdr_type *t2;
  SAM_hdr_type *t1;
  SAM_hdr_tag *tag;
  SAM_hdr_type *ty;
  undefined1 auStack_30 [4];
  khint_t k;
  kstring_t ks;
  SAM_hdr *hdr_local;
  
  ks.s = (char *)hdr;
  memset(auStack_30,0,0x18);
  kVar3 = kh_get_sam_hdr(*(kh_sam_hdr_t **)(ks.s + 0x18),0x4844);
  if (kVar3 != **(khint_t **)(ks.s + 0x18)) {
    lVar1 = *(long *)(*(long *)(*(long *)(ks.s + 0x18) + 0x20) + (ulong)kVar3 * 8);
    iVar4 = kputs("@HD",(kstring_t *)auStack_30);
    if (iVar4 == -1) {
      return -1;
    }
    for (t1 = *(SAM_hdr_type **)(lVar1 + 0x10); t1 != (SAM_hdr_type *)0x0; t1 = t1->next) {
      iVar4 = kputc_(9,(kstring_t *)auStack_30);
      if (iVar4 == -1) {
        return -1;
      }
      iVar4 = kputsn_(t1->prev,*(int *)&t1->tag,(kstring_t *)auStack_30);
      if (iVar4 == -1) {
        return -1;
      }
    }
    iVar4 = kputc(10,(kstring_t *)auStack_30);
    if (iVar4 == -1) {
      return -1;
    }
  }
  ty._4_4_ = 0;
  do {
    if (ty._4_4_ == **(uint **)(ks.s + 0x18)) {
      pcVar5 = ks_str((kstring_t *)ks.s);
      if ((pcVar5 != (char *)0x0) && (*(long *)(ks.s + 0x10) != 0)) {
        free(*(void **)(ks.s + 0x10));
      }
      *(size_t *)ks.s = _auStack_30;
      *(size_t *)(ks.s + 8) = ks.l;
      *(size_t *)(ks.s + 0x10) = ks.m;
      return 0;
    }
    if (((*(uint *)(*(long *)(*(long *)(ks.s + 0x18) + 0x10) + (ulong)(ty._4_4_ >> 4) * 4) >>
          (sbyte)((ty._4_4_ & 0xf) << 1) & 3) == 0) &&
       (*(int *)(*(long *)(*(long *)(ks.s + 0x18) + 0x18) + (ulong)ty._4_4_ * 4) != 0x4844)) {
      pSVar2 = *(SAM_hdr_item_s **)(*(long *)(*(long *)(ks.s + 0x18) + 0x20) + (ulong)ty._4_4_ * 8);
      t2 = pSVar2;
      do {
        iVar4 = kputc_(0x40,(kstring_t *)auStack_30);
        if (iVar4 == -1) {
          return -1;
        }
        local_62 = (undefined1)
                   ((uint)*(undefined4 *)
                           (*(long *)(*(long *)(ks.s + 0x18) + 0x18) + (ulong)ty._4_4_ * 4) >> 8);
        local_61 = (undefined1)
                   *(undefined4 *)(*(long *)(*(long *)(ks.s + 0x18) + 0x18) + (ulong)ty._4_4_ * 4);
        iVar4 = kputsn_(&local_62,2,(kstring_t *)auStack_30);
        if (iVar4 == -1) {
          return -1;
        }
        for (pSStack_60 = t2->tag; pSStack_60 != (SAM_hdr_tag *)0x0; pSStack_60 = pSStack_60->next)
        {
          iVar4 = kputc_(9,(kstring_t *)auStack_30);
          if (iVar4 == -1) {
            return -1;
          }
          iVar4 = kputsn_(pSStack_60->str,pSStack_60->len,(kstring_t *)auStack_30);
          if (iVar4 == -1) {
            return -1;
          }
        }
        iVar4 = kputc(10,(kstring_t *)auStack_30);
        if (iVar4 == -1) {
          return -1;
        }
        t2 = t2->next;
      } while (t2 != pSVar2);
    }
    ty._4_4_ = ty._4_4_ + 1;
  } while( true );
}

Assistant:

int sam_hdr_rebuild(SAM_hdr *hdr) {
    /* Order: HD then others */
    kstring_t ks = KS_INITIALIZER;
    khint_t k;


    k = kh_get(sam_hdr, hdr->h, K("HD"));
    if (k != kh_end(hdr->h)) {
	SAM_hdr_type *ty = kh_val(hdr->h, k);
	SAM_hdr_tag *tag;
	if (EOF == kputs("@HD", &ks))
	    return -1;
	for (tag = ty->tag; tag; tag = tag->next) {
	    if (EOF == kputc_('\t', &ks))
		return -1;
	    if (EOF == kputsn_(tag->str, tag->len, &ks))
		return -1;
	}
	if (EOF == kputc('\n', &ks))
	    return -1;
    }

    for (k = kh_begin(hdr->h); k != kh_end(hdr->h); k++) {
	SAM_hdr_type *t1, *t2;

	if (!kh_exist(hdr->h, k))
	    continue;

	if (kh_key(hdr->h, k) == K("HD"))
	    continue;

	t1 = t2 = kh_val(hdr->h, k);
	do {
	    SAM_hdr_tag *tag;
	    char c[2];

	    if (EOF == kputc_('@', &ks))
		return -1;
	    c[0] = kh_key(hdr->h, k)>>8;
	    c[1] = kh_key(hdr->h, k)&0xff;
	    if (EOF == kputsn_(c, 2, &ks))
		return -1;
	    for (tag = t1->tag; tag; tag=tag->next) {
		if (EOF == kputc_('\t', &ks))
		    return -1;
		if (EOF == kputsn_(tag->str, tag->len, &ks))
		    return -1;
	    }
	    if (EOF == kputc('\n', &ks))
		return -1;
	    t1 = t1->next;
	} while (t1 != t2);
    }

    if (ks_str(&hdr->text))
	KS_FREE(&hdr->text);

    hdr->text = ks;

    return 0;
}